

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void * xmlCopyElement(void *payload,xmlChar *name)

{
  xmlElementPtr elem;
  xmlChar *pxVar1;
  xmlElementContentPtr pxVar2;
  
  elem = (xmlElementPtr)(*xmlMalloc)(0x70);
  if (elem == (xmlElementPtr)0x0) {
    return (void *)0x0;
  }
  elem->_private = (void *)0x0;
  *(undefined8 *)&elem->type = 0;
  elem->prefix = (xmlChar *)0x0;
  elem->contModel = (xmlRegexpPtr)0x0;
  elem->content = (xmlElementContentPtr)0x0;
  elem->attributes = (xmlAttributePtr)0x0;
  elem->doc = (_xmlDoc *)0x0;
  *(undefined8 *)&elem->etype = 0;
  elem->next = (_xmlNode *)0x0;
  elem->prev = (_xmlNode *)0x0;
  elem->last = (_xmlNode *)0x0;
  elem->parent = (_xmlDtd *)0x0;
  elem->name = (xmlChar *)0x0;
  elem->children = (_xmlNode *)0x0;
  elem->type = XML_ELEMENT_DECL;
  elem->etype = *(xmlElementTypeVal *)((long)payload + 0x48);
  if (*(xmlChar **)((long)payload + 0x10) != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
    elem->name = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0015561f;
  }
  if (*(xmlChar **)((long)payload + 0x60) != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x60));
    elem->prefix = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0015561f;
  }
  if (*(xmlElementContentPtr *)((long)payload + 0x50) != (xmlElementContentPtr)0x0) {
    pxVar2 = xmlCopyDocElementContent
                       ((xmlDocPtr)0x0,*(xmlElementContentPtr *)((long)payload + 0x50));
    elem->content = pxVar2;
    if (pxVar2 == (xmlElementContentPtr)0x0) {
LAB_0015561f:
      xmlFreeElement(elem);
      return (void *)0x0;
    }
  }
  elem->attributes = (xmlAttributePtr)0x0;
  return elem;
}

Assistant:

static void *
xmlCopyElement(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlElementPtr elem = (xmlElementPtr) payload;
    xmlElementPtr cur;

    cur = (xmlElementPtr) xmlMalloc(sizeof(xmlElement));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlElement));
    cur->type = XML_ELEMENT_DECL;
    cur->etype = elem->etype;
    if (elem->name != NULL) {
	cur->name = xmlStrdup(elem->name);
        if (cur->name == NULL)
            goto error;
    }
    if (elem->prefix != NULL) {
	cur->prefix = xmlStrdup(elem->prefix);
        if (cur->prefix == NULL)
            goto error;
    }
    if (elem->content != NULL) {
        cur->content = xmlCopyElementContent(elem->content);
        if (cur->content == NULL)
            goto error;
    }
    /* TODO : rebuild the attribute list on the copy */
    cur->attributes = NULL;
    return(cur);

error:
    xmlFreeElement(cur);
    return(NULL);
}